

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void Qentem::MemoryRecord::RemoveAllocation(void *pointer)

{
  int iVar1;
  long lVar2;
  void *pointer_local;
  
  if (RemoveAllocation(void*)::storage == '\0') {
    iVar1 = __cxa_guard_acquire(&RemoveAllocation(void*)::storage);
    if (iVar1 != 0) {
      RemoveAllocation::storage = getStorage();
      __cxa_guard_release(&RemoveAllocation(void*)::storage);
    }
  }
  RemoveAllocation::storage->deallocations = RemoveAllocation::storage->deallocations + 1;
  RemoveAllocation::storage->subDeallocations = RemoveAllocation::storage->subDeallocations + 1;
  lVar2 = malloc_usable_size(pointer);
  RemoveAllocation::storage->remainingSize = RemoveAllocation::storage->remainingSize - lVar2;
  return;
}

Assistant:

QENTEM_NOINLINE static void RemoveAllocation(void *pointer) noexcept {
        static MemoryRecordData &storage = getStorage();

        ++(storage.deallocations);
        ++(storage.subDeallocations);

#if defined(_WIN32) || defined(_M_X64)
        storage.remainingSize -= _msize(pointer);
#elif defined(__APPLE__)
        storage.remainingSize -= malloc_size(pointer);
#else
        storage.remainingSize -= malloc_usable_size(pointer);
#endif
    }